

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::TextureCubeArrayView::sample
          (TextureCubeArrayView *this,Sampler *sampler,float s,float t,float r,float q,float lod)

{
  WrapMode WVar1;
  int iVar2;
  undefined4 numLevels;
  float fVar3;
  int slice;
  int iVar4;
  Sampler *sampler_00;
  int depth;
  long in_RDX;
  int i_2;
  int levelNdx;
  long lVar5;
  ConstPixelBufferAccess *pCVar6;
  CubeFace baseFace;
  Sampler *sampler_01;
  int iVar7;
  int iVar8;
  int i;
  int i_1;
  long lVar9;
  float fVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar11;
  Vec4 VVar12;
  Vector<float,_4> VVar13;
  CubeFaceFloatCoords CVar14;
  Vec4 t1;
  Vec4 t0;
  ConstPixelBufferAccess faceAccesses1 [6];
  ConstPixelBufferAccess faceAccesses [6];
  TextureFormat local_268;
  undefined8 uStack_260;
  TextureFormat local_258;
  int aiStack_250 [4];
  ConstPixelBufferAccess local_240;
  undefined1 local_218 [16];
  TextureFormat local_208;
  int aiStack_200 [2];
  TextureFormat local_1f8 [26];
  ConstPixelBufferAccess local_128 [6];
  
  pCVar6 = local_128;
  local_128[0].m_format.order = (ChannelOrder)s;
  local_128[0].m_format.type = (ChannelType)t;
  local_128[0].m_size.m_data[0] = (int)r;
  CVar14 = getCubeFaceCoords((Vec3 *)pCVar6);
  fVar10 = CVar14.t;
  sampler_00 = CVar14._0_8_;
  fVar3 = CVar14.s;
  slice = selectLayer((TextureCubeArrayView *)sampler,q);
  getCubeArrayFaceIndex(CVar14.face);
  depth = (int)in_RDX;
  if (*(char *)(in_RDX + 0x34) != '\x01') {
    numLevels = sampler->wrapR;
    VVar12 = sampleLevelArray2D((ConstPixelBufferAccess *)this,numLevels,
                                (Sampler *)(ulong)sampler->wrapS,fVar3,fVar10,depth,lod);
    lod = VVar12.m_data[2];
    fVar11 = VVar12.m_data[3];
    fVar3 = VVar12.m_data[0];
    fVar10 = VVar12.m_data[1];
    goto LAB_008e7b02;
  }
  sampler_01 = *(Sampler **)&sampler->wrapR;
  WVar1 = sampler->wrapS;
  getCubeArrayFaceIndex(CVar14.face);
  fVar11 = 0.0;
  iVar2 = *(int *)(in_RDX + 0xc + (ulong)(lod <= *(float *)(in_RDX + 0x14)) * 4);
  switch(iVar2) {
  case 0:
    goto LAB_008e7a50;
  case 1:
    lVar5 = 0;
    do {
      ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)((long)local_128[0].m_size.m_data + lVar5 + -8));
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0xf0);
    pCVar6 = local_128;
    for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
      getCubeArrayFaceAccess
                ((ConstPixelBufferAccess *)local_218,(ConstPixelBufferAccess *)sampler_01,0,slice,
                 (CubeFace)lVar5);
      pCVar6->m_data = (void *)local_1f8[0];
      *(TextureFormat *)((pCVar6->m_size).m_data + 2) = local_208;
      *(int (*) [2])((pCVar6->m_pitch).m_data + 1) = aiStack_200;
      (pCVar6->m_format).order = local_218._0_4_;
      (pCVar6->m_format).type = local_218._4_4_;
      *(undefined8 *)(pCVar6->m_size).m_data = local_218._8_8_;
      pCVar6 = pCVar6 + 1;
    }
    baseFace = (CubeFace)local_128;
LAB_008e7afa:
    VVar12 = sampleCubeSeamlessLinear
                       ((ConstPixelBufferAccess (*) [6])this,baseFace,sampler_00,fVar3,fVar10,depth)
    ;
    lod = VVar12.m_data[2];
    fVar11 = VVar12.m_data[3];
    fVar3 = VVar12.m_data[0];
    fVar10 = VVar12.m_data[1];
    break;
  case 2:
  case 4:
    iVar7 = WVar1 - CLAMP_TO_BORDER;
    fVar11 = ceilf(lod + 0.5);
    iVar8 = (int)fVar11 + -1;
    if (iVar8 < iVar7) {
      iVar7 = iVar8;
    }
    iVar4 = 0;
    if (-1 < iVar8) {
      iVar4 = iVar7;
    }
    if (iVar2 == 4) {
      lVar5 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)((long)local_128[0].m_size.m_data + lVar5 + -8));
        lVar5 = lVar5 + 0x28;
      } while (lVar5 != 0xf0);
      for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
        getCubeArrayFaceAccess
                  ((ConstPixelBufferAccess *)local_218,(ConstPixelBufferAccess *)sampler_01,iVar4,
                   slice,(CubeFace)lVar5);
        pCVar6->m_data = (void *)local_1f8[0];
        *(TextureFormat *)((pCVar6->m_size).m_data + 2) = local_208;
        *(int (*) [2])((pCVar6->m_pitch).m_data + 1) = aiStack_200;
        (pCVar6->m_format).order = local_218._0_4_;
        (pCVar6->m_format).type = local_218._4_4_;
        *(undefined8 *)(pCVar6->m_size).m_data = local_218._8_8_;
        pCVar6 = pCVar6 + 1;
      }
      baseFace = (CubeFace)local_128;
      goto LAB_008e7afa;
    }
    sampler_01 = (Sampler *)((TextureFormat *)&sampler_01->wrapS + (long)iVar4 * 5);
LAB_008e7a50:
    VVar12 = sampleCubeSeamlessNearest((ConstPixelBufferAccess *)this,sampler_01,fVar3,fVar10,depth)
    ;
    lod = VVar12.m_data[2];
    fVar11 = VVar12.m_data[3];
    fVar3 = VVar12.m_data[0];
    fVar10 = VVar12.m_data[1];
    break;
  case 3:
  case 5:
    iVar8 = WVar1 - CLAMP_TO_BORDER;
    fVar11 = floorf(lod);
    iVar4 = (int)fVar11;
    iVar7 = iVar8;
    if (iVar4 < iVar8) {
      iVar7 = iVar4;
    }
    levelNdx = 0;
    if (-1 < iVar4) {
      levelNdx = iVar7;
    }
    if (levelNdx + 1 <= iVar8) {
      iVar8 = levelNdx + 1;
    }
    Vector<float,_4>::Vector((Vector<float,_4> *)&local_258);
    Vector<float,_4>::Vector((Vector<float,_4> *)&local_268);
    if (iVar2 == 5) {
      lVar5 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)((long)local_128[0].m_size.m_data + lVar5 + -8));
        lVar5 = lVar5 + 0x28;
      } while (lVar5 != 0xf0);
      lVar5 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)(local_218 + lVar5));
        lVar5 = lVar5 + 0x28;
      } while (lVar5 != 0xf0);
      lVar5 = 0;
      for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
        getCubeArrayFaceAccess
                  (&local_240,(ConstPixelBufferAccess *)sampler_01,levelNdx,slice,(CubeFace)lVar9);
        *(void **)((long)(&local_128[0].m_pitch + 1) + lVar5) = local_240.m_data;
        *(undefined8 *)((long)local_128[0].m_size.m_data + lVar5 + 8) = local_240._16_8_;
        *(undefined8 *)((long)local_128[0].m_pitch.m_data + lVar5 + 4) =
             local_240.m_pitch.m_data._4_8_;
        *(TextureFormat *)((long)local_128[0].m_size.m_data + lVar5 + -8) = local_240.m_format;
        *(undefined8 *)((long)local_128[0].m_size.m_data + lVar5) = local_240.m_size.m_data._0_8_;
        getCubeArrayFaceAccess
                  (&local_240,(ConstPixelBufferAccess *)sampler_01,iVar8,slice,(CubeFace)lVar9);
        *(void **)((long)&local_1f8[0].order + lVar5) = local_240.m_data;
        *(undefined8 *)((long)&local_208.order + lVar5) = local_240._16_8_;
        *(undefined8 *)((long)&local_1f8[-1].order + lVar5) = local_240.m_pitch.m_data._4_8_;
        *(TextureFormat *)(local_218 + lVar5) = local_240.m_format;
        *(undefined8 *)(local_218 + lVar5 + 8) = local_240.m_size.m_data._0_8_;
        lVar5 = lVar5 + 0x28;
      }
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])&local_240,(CubeFace)local_128,
                 (Sampler *)((ulong)sampler_00 & 0xffffffff),fVar3,fVar10,depth);
      local_258 = local_240.m_format;
      aiStack_250[0] = local_240.m_size.m_data[0];
      aiStack_250[1] = local_240.m_size.m_data[1];
      pCVar6 = &local_240;
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])pCVar6,(CubeFace)local_218,
                 (Sampler *)((ulong)sampler_00 & 0xffffffff),fVar3,fVar10,depth);
    }
    else {
      sampleCubeSeamlessNearest
                (local_128,(Sampler *)((TextureFormat *)&sampler_01->wrapS + (long)levelNdx * 5),
                 fVar3,fVar10,depth);
      local_258.type = local_128[0].m_format.type;
      local_258.order = local_128[0].m_format.order;
      aiStack_250[1] = local_128[0].m_size.m_data[1];
      aiStack_250[0] = local_128[0].m_size.m_data[0];
      pCVar6 = local_128;
      sampleCubeSeamlessNearest
                (pCVar6,(Sampler *)((TextureFormat *)&sampler_01->wrapS + (long)iVar8 * 5),fVar3,
                 fVar10,depth);
    }
    local_268 = ((ConstPixelBufferAccess *)&pCVar6->m_format)->m_format;
    uStack_260 = *(undefined8 *)(pCVar6->m_size).m_data;
    tcu::operator*((tcu *)local_128,1.0 - (lod - fVar11),(Vector<float,_4> *)&local_258);
    tcu::operator*((tcu *)local_218,lod - fVar11,(Vector<float,_4> *)&local_268);
    VVar13 = tcu::operator+((tcu *)this,(Vector<float,_4> *)local_128,(Vector<float,_4> *)local_218)
    ;
    lod = VVar13.m_data[2];
    fVar11 = VVar13.m_data[3];
    fVar3 = VVar13.m_data[0];
    fVar10 = VVar13.m_data[1];
    break;
  default:
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    fVar3 = extraout_XMM0_Da;
    fVar10 = extraout_XMM0_Db;
  }
LAB_008e7b02:
  VVar12.m_data[1] = fVar10;
  VVar12.m_data[0] = fVar3;
  VVar12.m_data[3] = fVar11;
  VVar12.m_data[2] = lod;
  return (Vec4)VVar12.m_data;
}

Assistant:

tcu::Vec4 TextureCubeArrayView::sample (const Sampler& sampler, float s, float t, float r, float q, float lod) const
{
	const CubeFaceFloatCoords	coords		= getCubeFaceCoords(Vec3(s, t, r));
	const int					layer		= selectLayer(q);
	const int					faceDepth	= (layer * 6) + getCubeArrayFaceIndex(coords.face);

	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	if (sampler.seamlessCubeMap)
		return sampleCubeArraySeamless(m_levels, m_numLevels, layer, coords.face, sampler, coords.s, coords.t, lod);
	else
		return sampleLevelArray2D(m_levels, m_numLevels, sampler, coords.s, coords.t, faceDepth, lod);
}